

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,FRegList l)

{
  ulong uVar1;
  int iVar2;
  bool bVar3;
  int i_1;
  int i;
  long lVar4;
  ulong uVar5;
  Fp fp;
  int r [8];
  
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    r[lVar4] = (uint)((l.raw >> ((uint)lVar4 & 0x1f) & 1) != 0);
  }
  for (lVar4 = 1; lVar4 != 8; lVar4 = lVar4 + 1) {
    if (r[lVar4] != 0) {
      r[lVar4] = r[lVar4 + -1] + 1;
    }
  }
  uVar1 = 7;
  while (uVar5 = uVar1, uVar1 = uVar5 - 1, -1 < (int)uVar1) {
    if ((r[uVar1 & 0xffffffff] != 0) && (r[uVar5] != 0)) {
      r[uVar1 & 0xffffffff] = r[uVar5];
    }
  }
  bVar3 = true;
  for (fp.raw = 0; fp.raw < 8; fp.raw = fp.raw + iVar2 + 1) {
    iVar2 = r[fp.raw];
    if (iVar2 != 0) {
      if (!bVar3) {
        operator<<(this,"/");
      }
      operator<<(this,fp);
      if (iVar2 != 1) {
        operator<<(this,"-");
        operator<<(this,(Fp)(fp.raw + iVar2 + -1));
      }
      bVar3 = false;
    }
  }
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(FRegList l)
{
    int r[8];

    // Step 1: Fill array r with the register list bits, e.g., 11101101
    for (int i = 0; i <= 7; i++) { r[i] = !!(l.raw & (1 << i)); }

    // Step 2: Convert 11101101 to 12301201
    for (int i = 1; i <= 7; i++) { if (r[i]) r[i] = r[i-1] + 1; }

    // Step 3: Convert 12301201 to 33302201
    for (int i = 6; i >= 0; i--) { if (r[i] && r[i+1]) r[i] = r[i+1]; }

    // Step 4: Convert 33302201 to "FP0-FP2/FP4/FP5/FP7"
    bool first = true;
    for (int i = 0; i <= 7; i += r[i] + 1) {

        if (r[i] == 0) continue;

        // Print delimiter
        if (first) { first = false; } else { *this << "/"; }

        // Format variant 1: Single register
        if (r[i] == 1) { *this << Fp{i}; }

        // Format variant 2: Register range
        else { *this << Fp{i} << "-" << Fp{i+r[i]-1}; }
    }

    return *this;
}